

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_threshold.hpp
# Opt level: O0

void re::math::threshold_reference<float,512l,512l,512l>
               (span<const_float,_512L> in,span<float,_512L> out,span<float,_512L> thresh,
               int_t radius)

{
  long *plVar1;
  reference peVar2;
  float fVar3;
  storage_type<gsl::details::extent_type<_1L>_> sVar4;
  span<const_float,__1L> input;
  undefined1 local_d8 [24];
  span<float,_512L> local_c0 [2];
  span<float,_512L> local_b0 [2];
  span<const_float,_512L> local_a0 [2];
  span<const_float,_512L> local_90 [2];
  storage_type<gsl::details::extent_type<_1L>_> local_80;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long count;
  long local_48;
  long local_40;
  long offset;
  int_t i;
  index_type n;
  int_t radius_local;
  span<float,_512L> thresh_local;
  span<float,_512L> out_local;
  span<const_float,_512L> in_local;
  
  i = 0x200;
  n = radius;
  radius_local = (int_t)thresh.storage_.data_;
  thresh_local.storage_.data_ = out.storage_.data_;
  out_local.storage_.data_ =
       (storage_type<gsl::details::extent_type<512L>_>)
       (storage_type<gsl::details::extent_type<512L>_>)in.storage_.data_;
  for (offset = 0; offset < 0x200; offset = offset + 1) {
    local_48 = offset - n;
    count = 0;
    plVar1 = std::max<long>(&local_48,&count);
    local_40 = *plVar1;
    local_60 = 0x200 - local_40;
    local_68 = n * 2;
    plVar1 = std::min<long>(&local_60,&local_68);
    local_58 = *plVar1;
    local_70 = offset + n;
    plVar1 = std::min<long>(&local_58,&local_70);
    local_58 = *plVar1;
    sVar4 = (storage_type<gsl::details::extent_type<_1L>_>)
            gsl::span<const_float,_512L>::subspan
                      ((span<const_float,_512L> *)&out_local,local_40,local_58);
    input.storage_.data_ = (index_type)sVar4.data_;
    input.storage_.super_extent_type<_1L>.size_ = input.storage_.data_;
    local_80 = sVar4;
    fVar3 = mean<float,_1l>((math *)sVar4.super_extent_type<_1L>.size_.size_,input);
    peVar2 = gsl::span<float,_512L>::operator[]((span<float,_512L> *)&radius_local,offset);
    *peVar2 = fVar3;
  }
  ::std::cbegin<gsl::span<float_const,512l>>(local_90);
  ::std::cend<gsl::span<float_const,512l>>(local_a0);
  ::std::cbegin<gsl::span<float,512l>>(local_b0);
  ::std::begin<gsl::span<float,512l>>(local_c0);
  ::std::
  transform<gsl::details::span_iterator<gsl::span<float_const,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,re::math::threshold_reference<float,512l,512l,512l>(gsl::span<float_const,512l>,gsl::span<float,512l>,gsl::span<float,512l>,long)::_lambda(auto:1,auto:2)_1_>
            (local_d8,local_90,local_a0,local_b0,local_c0);
  return;
}

Assistant:

void threshold_reference(
    gsl::span<T const, N_in> in,
    gsl::span<T, N_out> out,
    gsl::span<T, N_thresh> thresh,
    int_t radius
) noexcept {
    assert(
        std::size(in) == std::size(out)
        && std::size(out) == std::size(thresh)
    );
    auto const n = std::size(in);

    for (int_t i = 0; i < n; ++i) {
        auto offset = std::max(i - radius, int_t{0});
        auto count = std::min(n - offset, 2*radius);
        count = std::min(count, i + radius);
        thresh[i] = mean(in.subspan(offset, count));
    }

    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::cbegin(thresh),
        std::begin(out),
        [] (auto value, auto threshold) {
            return std::fdim(value, threshold);
        }
    );
}